

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  byte *pbVar14;
  int iVar15;
  byte *pbVar16;
  long in_FS_OFFSET;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int local_58;
  double local_48;
  double dStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = -NAN;
  dStack_40 = -NAN;
  *pResult = 0.0;
  local_58 = 0;
  if (length != 0) {
    if (enc == '\x01') {
      iVar13 = 1;
      lVar9 = 1;
      pbVar14 = (byte *)z;
    }
    else {
      iVar13 = 1;
      for (lVar9 = (long)(int)(3 - (uint)enc); lVar9 < (int)(length & 0xfffffffe); lVar9 = lVar9 + 2
          ) {
        if (z[lVar9] != '\0') {
          iVar13 = -100;
          break;
        }
      }
      length = (uint)lVar9 ^ 1;
      pbVar14 = (byte *)(z + (enc & 1));
      lVar9 = 2;
    }
    pbVar16 = (byte *)(z + length);
    for (; pbVar14 < pbVar16; pbVar14 = pbVar14 + lVar9) {
      bVar2 = *pbVar14;
      if ((""[bVar2] & 1) == 0) {
        uVar6 = 0;
        lVar8 = 0;
        if ((bVar2 - 0x2b & 0xfd) == 0) {
          lVar8 = lVar9;
        }
        pbVar14 = pbVar14 + lVar8;
        iVar12 = 1;
        iVar7 = 0;
        iVar15 = 0;
        goto LAB_0013ec6e;
      }
    }
  }
LAB_0013f023:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_58;
LAB_0013ec6e:
  bVar3 = 1;
  iVar10 = 0;
  local_58 = iVar13;
  if (pbVar14 < pbVar16) {
    bVar3 = *pbVar14;
    if (0xfffffffffffffff5 < (ulong)bVar3 - 0x3a) {
      uVar6 = (uVar6 * 10 + (long)(char)bVar3) - 0x30;
      pbVar14 = pbVar14 + lVar9;
      iVar15 = iVar15 + 1;
      if (0x1999999999999997 < uVar6) {
        for (; (pbVar14 < pbVar16 && (0xfffffffffffffff5 < (ulong)*pbVar14 - 0x3a));
            pbVar14 = pbVar14 + lVar9) {
          iVar7 = iVar7 + 1;
        }
      }
      goto LAB_0013ec6e;
    }
    if (bVar3 == 0x2e) {
      local_58 = iVar13 + 1;
      while ((pbVar1 = pbVar14 + lVar9, pbVar1 < pbVar16 &&
             (0xfffffffffffffff5 < (ulong)*pbVar1 - 0x3a))) {
        pbVar14 = pbVar1;
        if (uVar6 < 0x1999999999999998) {
          uVar6 = (uVar6 * 10 + (long)(char)*pbVar1) - 0x30;
          iVar7 = iVar7 + -1;
          iVar15 = iVar15 + 1;
        }
      }
      pbVar14 = pbVar14 + lVar9;
    }
    bVar3 = 1;
    iVar10 = 0;
    if (pbVar14 < pbVar16) {
      if ((*pbVar14 | 0x20) == 0x65) {
        pbVar14 = pbVar14 + lVar9;
        local_58 = local_58 + 1;
        if (pbVar16 <= pbVar14) {
          iVar10 = 0;
          iVar12 = 1;
          bVar3 = 0;
          goto LAB_0013ed8e;
        }
        iVar12 = 1;
        if (*pbVar14 == 0x2b) {
          pbVar14 = pbVar14 + lVar9;
        }
        else if (*pbVar14 == 0x2d) {
          pbVar14 = pbVar14 + lVar9;
          iVar12 = -1;
        }
        iVar10 = 0;
        bVar3 = 0;
        for (; (pbVar14 < pbVar16 && (0xfffffffffffffff5 < (ulong)*pbVar14 - 0x3a));
            pbVar14 = pbVar14 + lVar9) {
          bVar4 = 9999 < iVar10;
          iVar10 = iVar10 * 10 + -0x30 + (int)(char)*pbVar14;
          if (bVar4) {
            iVar10 = 10000;
          }
          bVar3 = 1;
        }
      }
      else {
        bVar3 = 1;
        iVar10 = 0;
        iVar12 = 1;
      }
      while ((pbVar14 < pbVar16 && ((""[*pbVar14] & 1) != 0))) {
        pbVar14 = pbVar14 + lVar9;
      }
    }
  }
LAB_0013ed8e:
  if (uVar6 == 0) {
    if (bVar2 == 0x2d) {
      dVar17 = -0.0;
    }
    else {
      dVar17 = 0.0;
    }
LAB_0013efe1:
    *pResult = dVar17;
  }
  else {
    uVar11 = iVar10 * iVar12 + iVar7;
    for (; (0 < (int)uVar11 && (uVar6 < 0x19999999999998cc)); uVar6 = uVar6 * 10) {
      uVar11 = uVar11 - 1;
    }
    while( true ) {
      if ((-1 < (int)uVar11) || (uVar6 % 10 != 0)) break;
      uVar11 = uVar11 + 1;
      uVar6 = uVar6 / 10;
    }
    auVar18._8_4_ = (int)(uVar6 >> 0x20);
    auVar18._0_8_ = uVar6;
    auVar18._12_4_ = 0x45300000;
    local_48 = (auVar18._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
    dStack_40 = 0.0;
    if (local_48 <= 1.844674407370955e+19) {
      uVar5 = (long)(local_48 - 9.223372036854776e+18) & (long)local_48 >> 0x3f | (long)local_48;
      lVar9 = uVar6 - uVar5;
      if (uVar6 < uVar5) {
        lVar9 = uVar5 - uVar6;
        auVar20._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar20._0_8_ = lVar9;
        auVar20._12_4_ = 0x45300000;
        dStack_40 = -((auVar20._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
      }
      else {
        auVar21._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar21._0_8_ = lVar9;
        auVar21._12_4_ = 0x45300000;
        dStack_40 = (auVar21._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0);
      }
    }
    if ((int)uVar11 < 1) {
      for (; (int)uVar11 < -99; uVar11 = uVar11 + 100) {
        dekkerMul2(&local_48,1e-100,-1.9991899802602883e-117);
      }
      for (; (int)uVar11 < -9; uVar11 = uVar11 + 10) {
        dekkerMul2(&local_48,1e-10,-3.643219731549774e-27);
      }
      for (; (int)uVar11 < 0; uVar11 = uVar11 + 1) {
        dekkerMul2(&local_48,0.1,-5.551115123125783e-18);
      }
    }
    else {
      for (; 99 < uVar11; uVar11 = uVar11 - 100) {
        dekkerMul2(&local_48,1e+100,-1.5902891109759918e+83);
      }
      for (; 9 < uVar11; uVar11 = uVar11 - 10) {
        dekkerMul2(&local_48,10000000000.0,0.0);
      }
      for (; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
        dekkerMul2(&local_48,10.0,0.0);
      }
    }
    dVar17 = local_48 + dStack_40;
    dVar19 = dVar17;
    if (((ulong)dVar17 & 0xfffffffffffff) != 0) {
      dVar19 = INFINITY;
    }
    if ((~(ulong)dVar17 & 0x7ff0000000000000) == 0) {
      dVar17 = dVar19;
    }
    *pResult = dVar17;
    if (bVar2 == 0x2d) {
      dVar17 = -dVar17;
      goto LAB_0013efe1;
    }
  }
  if (!(bool)((0 < iVar15 && pbVar14 == pbVar16) & bVar3 & 0 < local_58)) {
    if ((local_58 < 2) || (!(bool)((bVar3 | local_58 == 3) & 0 < iVar15))) {
      local_58 = 0;
    }
    else {
      local_58 = -1;
    }
  }
  goto LAB_0013f023;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  u64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  int nDigit = 0;  /* Number of digits processed */
  int eType = 1;   /* 1: pure integer,  2+: fractional  -1 or less: bad UTF16 */
  u64 s2;          /* round-tripped significand */
  double rr[2];

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */
  if( length==0 ) return 0;

  if( enc==SQLITE_UTF8 ){
    incr = 1;
    zEnd = z + length;
  }else{
    int i;
    incr = 2;
    length &= ~1;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    testcase( enc==SQLITE_UTF16LE );
    testcase( enc==SQLITE_UTF16BE );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    if( i<length ) eType = -100;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigit++;
    if( s>=((LARGEST_UINT64-9)/10) ){
      /* skip non-significant significand digits
      ** (increase exponent by d to shift decimal left) */
      while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; d++; }
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    eType++;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_UINT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
        nDigit++;
      }
      z+=incr;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    eType++;

    /* This branch is needed to avoid a (harmless) buffer overread.  The
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* Zero is a special case */
  if( s==0 ){
    *pResult = sign<0 ? -0.0 : +0.0;
    goto atof_return;
  }

  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;

  /* Try to adjust the exponent to make it smaller */
  while( e>0 && s<((LARGEST_UINT64-0x7ff)/10) ){
    s *= 10;
    e--;
  }
  while( e<0 && (s%10)==0 ){
    s /= 10;
    e++;
  }

  rr[0] = (double)s;
  assert( sizeof(s2)==sizeof(rr[0]) );
#ifdef SQLITE_DEBUG
  rr[1] = 18446744073709549568.0;
  memcpy(&s2, &rr[1], sizeof(s2));
  assert( s2==0x43efffffffffffffLL );
#endif
  /* Largest double that can be safely converted to u64
  **         vvvvvvvvvvvvvvvvvvvvvv   */
  if( rr[0]<=18446744073709549568.0 ){
    s2 = (u64)rr[0];
    rr[1] = s>=s2 ? (double)(s - s2) : -(double)(s2 - s);
  }else{
    rr[1] = 0.0;
  }
  assert( rr[1]<=1.0e-10*rr[0] );  /* Equal only when rr[0]==0.0 */

  if( e>0 ){
    while( e>=100  ){
      e -= 100;
      dekkerMul2(rr, 1.0e+100, -1.5902891109759918046e+83);
    }
    while( e>=10   ){
      e -= 10;
      dekkerMul2(rr, 1.0e+10, 0.0);
    }
    while( e>=1    ){
      e -= 1;
      dekkerMul2(rr, 1.0e+01, 0.0);
    }
  }else{
    while( e<=-100 ){
      e += 100;
      dekkerMul2(rr, 1.0e-100, -1.99918998026028836196e-117);
    }
    while( e<=-10  ){
      e += 10;
      dekkerMul2(rr, 1.0e-10, -3.6432197315497741579e-27);
    }
    while( e<=-1   ){
      e += 1;
      dekkerMul2(rr, 1.0e-01, -5.5511151231257827021e-18);
    }
  }
  *pResult = rr[0]+rr[1];
  if( sqlite3IsNaN(*pResult) ) *pResult = 1e300*1e300;
  if( sign<0 ) *pResult = -*pResult;
  assert( !sqlite3IsNaN(*pResult) );

atof_return:
  /* return true if number and no extra non-whitespace characters after */
  if( z==zEnd && nDigit>0 && eValid && eType>0 ){
    return eType;
  }else if( eType>=2 && (eType==3 || eValid) && nDigit>0 ){
    return -1;
  }else{
    return 0;
  }
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}